

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O3

void __thiscall irr::gui::CGUIListBox::~CGUIListBox(CGUIListBox *this)

{
  long lVar1;
  
  lVar1 = *(long *)(*(long *)this + -0x18);
  ~CGUIListBox((CGUIListBox *)(&this->field_0x0 + lVar1),&VTT);
  operator_delete((CGUIListBox *)(&this->field_0x0 + lVar1),0x1d0);
  return;
}

Assistant:

CGUIListBox::~CGUIListBox()
{
	if (ScrollBar)
		ScrollBar->drop();

	if (Font)
		Font->drop();

	if (IconBank)
		IconBank->drop();
}